

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::RenderPassVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator=
          (RefCntAutoPtr<Diligent::RenderPassVkImpl> *this,RenderPassVkImpl *pObj)

{
  RenderPassVkImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (RenderPassVkImpl *)0x0) {
      DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      ::Release((DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                 *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (RenderPassVkImpl *)0x0) {
      RefCountedObject<Diligent::IRenderPassVk>::AddRef
                ((RefCountedObject<Diligent::IRenderPassVk> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }